

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O1

Time __thiscall helics::TimeCoordinator::getNextPossibleTime(TimeCoordinator *this)

{
  ulong uVar1;
  ulong uVar2;
  Time TVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  if ((this->time_granted).internalTimeCode == 0) {
    lVar7 = (this->info).timeDelta.internalTimeCode;
    lVar5 = (this->info).offset.internalTimeCode;
    lVar6 = lVar5;
    if (lVar5 <= lVar7) {
      uVar1 = (this->info).period.internalTimeCode;
      if (lVar5 == 0) {
        if (lVar7 < (long)uVar1) {
          lVar7 = 0x7fffffffffffffff;
          uVar2 = (this->info).period.internalTimeCode;
          TVar3.internalTimeCode = uVar1;
          if (uVar1 != 0x7fffffffffffffff && 1 < (long)uVar2) {
            lVar5 = (this->time_grantBase).internalTimeCode;
            TVar3.internalTimeCode = (this->info).offset.internalTimeCode;
            if ((TVar3.internalTimeCode <= lVar5) ||
               (lVar5 = TVar3.internalTimeCode, TVar3.internalTimeCode < (long)uVar1)) {
              lVar6 = uVar1 - lVar5;
              if ((long)uVar2 < lVar6) {
                dVar9 = (double)((int)uVar2 + (int)(uVar2 / 1000000000) * -1000000000) * 1e-09 +
                        (double)(uVar2 / 1000000000);
                dVar8 = ceil(((double)(lVar6 % 1000000000) * 1e-09 + (double)(lVar6 / 1000000000)) /
                             dVar9);
                dVar8 = dVar8 * dVar9;
                if (dVar8 <= -9223372036.854765) {
                  lVar7 = -0x7fffffffffffffff;
                }
                else if (dVar8 < 9223372036.854765) {
                  lVar7 = (long)(dVar8 * 1000000000.0 +
                                *(double *)
                                 (&DAT_0042cab0 + (ulong)(0.0 <= dVar8 * 1000000000.0) * 8));
                }
                TVar3.internalTimeCode = lVar7 + lVar5;
              }
              else {
                TVar3.internalTimeCode = lVar5 + uVar2;
              }
            }
          }
          return (Time)TVar3.internalTimeCode;
        }
        TVar3 = generateAllowedTime(this,(this->info).timeDelta.internalTimeCode);
        return (Time)TVar3.internalTimeCode;
      }
      lVar6 = lVar7;
      if (1 < (long)uVar1) {
        lVar6 = uVar1 + lVar5;
        lVar4 = lVar7;
        if (lVar7 <= lVar6) {
          lVar4 = lVar6;
        }
        lVar6 = lVar5 + ((lVar4 - (lVar6 + (ulong)(lVar6 < lVar7))) / uVar1 + (ulong)(lVar6 < lVar7)
                        + 1) * uVar1;
      }
    }
  }
  else {
    lVar7 = (this->info).timeDelta.internalTimeCode;
    lVar5 = (this->info).period.internalTimeCode;
    if (lVar5 < lVar7) {
      lVar5 = lVar7;
    }
    lVar7 = (this->time_grantBase).internalTimeCode;
    lVar6 = 0x7fffffffffffffff;
    if (lVar7 < 0x7fffffffffffffff - lVar5) {
      TVar3 = generateAllowedTime(this,(Time)(lVar5 + lVar7));
      return (Time)TVar3.internalTimeCode;
    }
  }
  return (Time)lVar6;
}

Assistant:

bool operator==(const TimeRepresentation& rhs) const noexcept
    {
        return (internalTimeCode == rhs.internalTimeCode);
    }